

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3VdbeMemTranslate(Mem *pMem,u8 desiredEnc)

{
  undefined1 uVar1;
  ushort uVar2;
  byte bVar3;
  int iVar4;
  undefined1 *puVar5;
  undefined1 *puVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  char in_SIL;
  long in_RDI;
  bool bVar10;
  int c2_1;
  int c2;
  int rc;
  u8 temp;
  uint c;
  uchar *z;
  uchar *zTerm;
  uchar *zIn;
  uchar *zOut;
  int len;
  sqlite3 *in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb2;
  undefined1 in_stack_ffffffffffffffb3;
  undefined4 in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  uint local_3c;
  byte *local_38;
  byte *local_28;
  
  if ((*(char *)(in_RDI + 10) == '\x01') || (in_SIL == '\x01')) {
    if (in_SIL == '\x01') {
      *(uint *)(in_RDI + 0xc) = *(uint *)(in_RDI + 0xc) & 0xfffffffe;
    }
    local_28 = *(byte **)(in_RDI + 0x10);
    pbVar7 = local_28 + *(int *)(in_RDI + 0xc);
    pbVar8 = (byte *)sqlite3DbMallocRaw((sqlite3 *)
                                        CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8
                                                ),
                                        CONCAT44(in_stack_ffffffffffffffb4,
                                                 CONCAT13(in_stack_ffffffffffffffb3,
                                                          CONCAT12(in_stack_ffffffffffffffb2,
                                                                   in_stack_ffffffffffffffb0))));
    if (pbVar8 == (byte *)0x0) {
      return 7;
    }
    local_38 = pbVar8;
    if (*(char *)(in_RDI + 10) == '\x01') {
      if (in_SIL == '\x02') {
        while (local_28 < pbVar7) {
          pbVar9 = local_28 + 1;
          local_3c = (uint)*local_28;
          local_28 = pbVar9;
          if (0xbf < local_3c) {
            local_3c = (uint)""[local_3c - 0xc0];
            while( true ) {
              bVar10 = false;
              if (local_28 != pbVar7) {
                bVar10 = (*local_28 & 0xc0) == 0x80;
              }
              if (!bVar10) break;
              local_3c = local_3c * 0x40 + (*local_28 & 0x3f);
              local_28 = local_28 + 1;
            }
            if (((local_3c < 0x80) || ((local_3c & 0xfffff800) == 0xd800)) ||
               ((local_3c & 0xfffffffe) == 0xfffe)) {
              local_3c = 0xfffd;
            }
          }
          bVar3 = (byte)(local_3c >> 8);
          if (local_3c < 0x10000) {
            pbVar9 = local_38 + 1;
            *local_38 = (byte)local_3c;
            local_38 = local_38 + 2;
            *pbVar9 = bVar3;
          }
          else {
            *local_38 = ((byte)(local_3c >> 10) & 0x3f) + ((byte)(local_3c - 0x10000 >> 10) & 0xc0);
            local_38[1] = ((byte)(local_3c - 0x10000 >> 0x12) & 3) - 0x28;
            pbVar9 = local_38 + 3;
            local_38[2] = (byte)local_3c;
            local_38 = local_38 + 4;
            *pbVar9 = (bVar3 & 3) - 0x24;
          }
        }
      }
      else {
        while (local_28 < pbVar7) {
          pbVar9 = local_28 + 1;
          local_3c = (uint)*local_28;
          local_28 = pbVar9;
          if (0xbf < local_3c) {
            local_3c = (uint)""[local_3c - 0xc0];
            while( true ) {
              bVar10 = false;
              if (local_28 != pbVar7) {
                bVar10 = (*local_28 & 0xc0) == 0x80;
              }
              if (!bVar10) break;
              local_3c = local_3c * 0x40 + (*local_28 & 0x3f);
              local_28 = local_28 + 1;
            }
            if (((local_3c < 0x80) || ((local_3c & 0xfffff800) == 0xd800)) ||
               ((local_3c & 0xfffffffe) == 0xfffe)) {
              local_3c = 0xfffd;
            }
          }
          bVar3 = (byte)(local_3c >> 8);
          if (local_3c < 0x10000) {
            pbVar9 = local_38 + 1;
            *local_38 = bVar3;
            local_38 = local_38 + 2;
            *pbVar9 = (byte)local_3c;
          }
          else {
            *local_38 = ((byte)(local_3c - 0x10000 >> 0x12) & 3) - 0x28;
            local_38[1] = ((byte)(local_3c >> 10) & 0x3f) +
                          ((byte)(local_3c - 0x10000 >> 10) & 0xc0);
            pbVar9 = local_38 + 3;
            local_38[2] = (bVar3 & 3) - 0x24;
            local_38 = local_38 + 4;
            *pbVar9 = (byte)local_3c;
          }
        }
      }
      *(int *)(in_RDI + 0xc) = (int)local_38 - (int)pbVar8;
      *local_38 = 0;
      local_38 = local_38 + 1;
    }
    else {
      if (*(char *)(in_RDI + 10) == '\x02') {
        while (local_28 < pbVar7) {
          pbVar9 = local_28 + 2;
          local_3c = (uint)local_28[1] * 0x100 + (uint)*local_28;
          if (((0xd7ff < local_3c) && (local_3c < 0xe000)) && (pbVar9 < pbVar7)) {
            local_3c = ((uint)local_28[3] * 0x100 + (uint)*pbVar9 & 0x3ff) +
                       (local_3c & 0x3f) * 0x400 + ((local_3c & 0x3c0) + 0x40) * 0x400;
            pbVar9 = local_28 + 4;
          }
          local_28 = pbVar9;
          bVar3 = (byte)local_3c;
          if (local_3c < 0x80) {
            *local_38 = bVar3;
            local_38 = local_38 + 1;
          }
          else if (local_3c < 0x800) {
            pbVar9 = local_38 + 1;
            *local_38 = ((byte)(local_3c >> 6) & 0x1f) - 0x40;
            local_38 = local_38 + 2;
            *pbVar9 = (bVar3 & 0x3f) + 0x80;
          }
          else if (local_3c < 0x10000) {
            *local_38 = ((byte)(local_3c >> 0xc) & 0xf) - 0x20;
            pbVar9 = local_38 + 2;
            local_38[1] = ((byte)(local_3c >> 6) & 0x3f) + 0x80;
            local_38 = local_38 + 3;
            *pbVar9 = (bVar3 & 0x3f) + 0x80;
          }
          else {
            *local_38 = ((byte)(local_3c >> 0x12) & 7) - 0x10;
            local_38[1] = ((byte)(local_3c >> 0xc) & 0x3f) + 0x80;
            pbVar9 = local_38 + 3;
            local_38[2] = ((byte)(local_3c >> 6) & 0x3f) + 0x80;
            local_38 = local_38 + 4;
            *pbVar9 = (bVar3 & 0x3f) + 0x80;
          }
        }
      }
      else {
        while (local_28 < pbVar7) {
          pbVar9 = local_28 + 2;
          local_3c = (uint)local_28[1] + (uint)*local_28 * 0x100;
          if (((0xd7ff < local_3c) && (local_3c < 0xe000)) && (pbVar9 < pbVar7)) {
            local_3c = ((uint)local_28[3] + (uint)*pbVar9 * 0x100 & 0x3ff) +
                       (local_3c & 0x3f) * 0x400 + ((local_3c & 0x3c0) + 0x40) * 0x400;
            pbVar9 = local_28 + 4;
          }
          local_28 = pbVar9;
          bVar3 = (byte)local_3c;
          if (local_3c < 0x80) {
            *local_38 = bVar3;
            local_38 = local_38 + 1;
          }
          else if (local_3c < 0x800) {
            pbVar9 = local_38 + 1;
            *local_38 = ((byte)(local_3c >> 6) & 0x1f) - 0x40;
            local_38 = local_38 + 2;
            *pbVar9 = (bVar3 & 0x3f) + 0x80;
          }
          else if (local_3c < 0x10000) {
            *local_38 = ((byte)(local_3c >> 0xc) & 0xf) - 0x20;
            pbVar9 = local_38 + 2;
            local_38[1] = ((byte)(local_3c >> 6) & 0x3f) + 0x80;
            local_38 = local_38 + 3;
            *pbVar9 = (bVar3 & 0x3f) + 0x80;
          }
          else {
            *local_38 = ((byte)(local_3c >> 0x12) & 7) - 0x10;
            local_38[1] = ((byte)(local_3c >> 0xc) & 0x3f) + 0x80;
            pbVar9 = local_38 + 3;
            local_38[2] = ((byte)(local_3c >> 6) & 0x3f) + 0x80;
            local_38 = local_38 + 4;
            *pbVar9 = (bVar3 & 0x3f) + 0x80;
          }
        }
      }
      *(int *)(in_RDI + 0xc) = (int)local_38 - (int)pbVar8;
    }
    *local_38 = 0;
    uVar2 = *(ushort *)(in_RDI + 8);
    sqlite3VdbeMemRelease((Mem *)0x13dc86);
    *(ushort *)(in_RDI + 8) = uVar2 & 0x1f | 0x202;
    *(char *)(in_RDI + 10) = in_SIL;
    *(byte **)(in_RDI + 0x10) = pbVar8;
    *(undefined8 *)(in_RDI + 0x18) = *(undefined8 *)(in_RDI + 0x10);
    iVar4 = sqlite3DbMallocSize(in_stack_ffffffffffffffa8,(void *)0x13dce1);
    *(int *)(in_RDI + 0x20) = iVar4;
  }
  else {
    iVar4 = sqlite3VdbeMemMakeWriteable((Mem *)in_stack_ffffffffffffffa8);
    if (iVar4 != 0) {
      return 7;
    }
    local_28 = *(byte **)(in_RDI + 0x10);
    puVar5 = local_28 + (int)(*(uint *)(in_RDI + 0xc) & 0xfffffffe);
    while (local_28 < puVar5) {
      uVar1 = *local_28;
      *local_28 = local_28[1];
      puVar6 = local_28 + 1;
      local_28 = local_28 + 2;
      *puVar6 = uVar1;
    }
    *(char *)(in_RDI + 10) = in_SIL;
  }
  return 0;
}

Assistant:

int sqlite3VdbeMemTranslate(Mem *pMem, u8 desiredEnc){
  int len;                    /* Maximum length of output string in bytes */
  unsigned char *zOut;                  /* Output buffer */
  unsigned char *zIn;                   /* Input iterator */
  unsigned char *zTerm;                 /* End of input */
  unsigned char *z;                     /* Output iterator */
  unsigned int c;

  assert( pMem->db==0 || sqlite3_mutex_held(pMem->db->mutex) );
  assert( pMem->flags&MEM_Str );
  assert( pMem->enc!=desiredEnc );
  assert( pMem->enc!=0 );
  assert( pMem->n>=0 );

#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "INPUT:  %s\n", zBuf);
  }
#endif

  /* If the translation is between UTF-16 little and big endian, then 
  ** all that is required is to swap the byte order. This case is handled
  ** differently from the others.
  */
  if( pMem->enc!=SQLITE_UTF8 && desiredEnc!=SQLITE_UTF8 ){
    u8 temp;
    int rc;
    rc = sqlite3VdbeMemMakeWriteable(pMem);
    if( rc!=SQLITE_OK ){
      assert( rc==SQLITE_NOMEM );
      return SQLITE_NOMEM;
    }
    zIn = (u8*)pMem->z;
    zTerm = &zIn[pMem->n&~1];
    while( zIn<zTerm ){
      temp = *zIn;
      *zIn = *(zIn+1);
      zIn++;
      *zIn++ = temp;
    }
    pMem->enc = desiredEnc;
    goto translate_out;
  }

  /* Set len to the maximum number of bytes required in the output buffer. */
  if( desiredEnc==SQLITE_UTF8 ){
    /* When converting from UTF-16, the maximum growth results from
    ** translating a 2-byte character to a 4-byte UTF-8 character.
    ** A single byte is required for the output string
    ** nul-terminator.
    */
    pMem->n &= ~1;
    len = pMem->n * 2 + 1;
  }else{
    /* When converting from UTF-8 to UTF-16 the maximum growth is caused
    ** when a 1-byte UTF-8 character is translated into a 2-byte UTF-16
    ** character. Two bytes are required in the output buffer for the
    ** nul-terminator.
    */
    len = pMem->n * 2 + 2;
  }

  /* Set zIn to point at the start of the input buffer and zTerm to point 1
  ** byte past the end.
  **
  ** Variable zOut is set to point at the output buffer, space obtained
  ** from sqlite3_malloc().
  */
  zIn = (u8*)pMem->z;
  zTerm = &zIn[pMem->n];
  zOut = sqlite3DbMallocRaw(pMem->db, len);
  if( !zOut ){
    return SQLITE_NOMEM;
  }
  z = zOut;

  if( pMem->enc==SQLITE_UTF8 ){
    if( desiredEnc==SQLITE_UTF16LE ){
      /* UTF-8 -> UTF-16 Little-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16LE(z, c);
      }
    }else{
      assert( desiredEnc==SQLITE_UTF16BE );
      /* UTF-8 -> UTF-16 Big-endian */
      while( zIn<zTerm ){
        READ_UTF8(zIn, zTerm, c);
        WRITE_UTF16BE(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
    *z++ = 0;
  }else{
    assert( desiredEnc==SQLITE_UTF8 );
    if( pMem->enc==SQLITE_UTF16LE ){
      /* UTF-16 Little-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16LE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }else{
      /* UTF-16 Big-endian -> UTF-8 */
      while( zIn<zTerm ){
        READ_UTF16BE(zIn, zIn<zTerm, c); 
        WRITE_UTF8(z, c);
      }
    }
    pMem->n = (int)(z - zOut);
  }
  *z = 0;
  assert( (pMem->n+(desiredEnc==SQLITE_UTF8?1:2))<=len );

  c = pMem->flags;
  sqlite3VdbeMemRelease(pMem);
  pMem->flags = MEM_Str|MEM_Term|(c&MEM_AffMask);
  pMem->enc = desiredEnc;
  pMem->z = (char*)zOut;
  pMem->zMalloc = pMem->z;
  pMem->szMalloc = sqlite3DbMallocSize(pMem->db, pMem->z);

translate_out:
#if defined(TRANSLATE_TRACE) && defined(SQLITE_DEBUG)
  {
    char zBuf[100];
    sqlite3VdbeMemPrettyPrint(pMem, zBuf);
    fprintf(stderr, "OUTPUT: %s\n", zBuf);
  }
#endif
  return SQLITE_OK;
}